

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_mem_legacy.c
# Opt level: O2

void release_vpu_memory_pool_allocator(vpu_display_mem_pool *ipool)

{
  vpu_display_mem_pool_impl *p_mempool;
  
  if (ipool != (vpu_display_mem_pool *)0x0) {
    if (((byte)vpu_mem_debug & 1) != 0) {
      _mpp_log_l(4,0,"pool %p group %p\n","release_vpu_memory_pool_allocator",ipool,
                 ipool[1].commit_hdl);
    }
    if (ipool[1].commit_hdl != (_func_RK_S32_vpu_display_mem_pool_ptr_RK_S32_RK_S32 *)0x0) {
      mpp_buffer_group_put();
      ipool[1].commit_hdl = (_func_RK_S32_vpu_display_mem_pool_ptr_RK_S32_RK_S32 *)0x0;
    }
    if (((byte)vpu_mem_debug & 1) != 0) {
      _mpp_log_l(4,0,"free %p\n","release_vpu_memory_pool_allocator",ipool);
    }
    mpp_osal_free("release_vpu_memory_pool_allocator",ipool);
    return;
  }
  return;
}

Assistant:

void release_vpu_memory_pool_allocator(vpu_display_mem_pool *ipool)
{
    vpu_display_mem_pool_impl *p_mempool = (vpu_display_mem_pool_impl *)ipool;
    if (p_mempool == NULL)
        return;

    vpu_mem_dbg_func("pool %p group %p\n", p_mempool, p_mempool->group);

    if (p_mempool->group) {
        mpp_buffer_group_put(p_mempool->group);
        p_mempool->group = NULL;
    }

    vpu_mem_dbg_func("free %p\n", p_mempool);
    mpp_free(p_mempool);
    return;
}